

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mv_generic.h
# Opt level: O3

void m2v_L_mult_inplace(m2v *LU,m2v *X_inout)

{
  uint *puVar1;
  m2v_base *pmVar2;
  m2v_base *pmVar3;
  bool bVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  ulong uVar10;
  uint uVar11;
  uint uVar12;
  long lVar13;
  
  uVar6 = LU->n_row;
  uVar5 = uVar6;
  if (0 < (int)uVar6) {
    do {
      uVar5 = uVar5 - 1;
      uVar7 = uVar6 - 1;
      uVar8 = LU->n_col;
      if ((int)uVar8 < (int)uVar6) {
        uVar11 = X_inout->row_stride;
        if (0 < (int)uVar11) {
          uVar8 = uVar11 * uVar5;
          pmVar2 = X_inout->e;
          lVar13 = 0;
          do {
            pmVar2[(ulong)uVar8 + lVar13] = 0;
            lVar13 = lVar13 + 1;
            uVar11 = X_inout->row_stride;
          } while (lVar13 < (int)uVar11);
          uVar8 = LU->n_col;
        }
        uVar10 = (ulong)uVar11;
        if (0 < (int)uVar8) {
          pmVar2 = LU->e;
          uVar11 = uVar8;
          do {
            uVar8 = uVar8 - 1;
            uVar12 = uVar11 - 1;
            if (((pmVar2[(int)((uVar12 >> 5) + LU->row_stride * uVar7)] >> (uVar12 & 0x1f) & 1) != 0
                ) && (iVar9 = (int)uVar10, 0 < iVar9)) {
              pmVar3 = X_inout->e;
              lVar13 = 0;
              do {
                puVar1 = pmVar3 + (int)(uVar5 * iVar9) + lVar13;
                *puVar1 = *puVar1 ^ pmVar3[(ulong)(iVar9 * uVar8) + lVar13];
                lVar13 = lVar13 + 1;
                uVar10 = (ulong)X_inout->row_stride;
              } while (lVar13 < (long)uVar10);
            }
            bVar4 = 1 < (int)uVar11;
            uVar11 = uVar12;
          } while (bVar4);
        }
      }
      else {
        if (uVar6 < 2) {
          return;
        }
        pmVar2 = LU->e;
        uVar8 = uVar6 - 2;
        do {
          if (((pmVar2[(int)((uVar8 >> 5) + LU->row_stride * uVar7)] >> (uVar8 & 0x1f) & 1) != 0) &&
             (iVar9 = X_inout->row_stride, 0 < iVar9)) {
            pmVar3 = X_inout->e;
            lVar13 = 0;
            do {
              puVar1 = pmVar3 + (int)(uVar5 * iVar9) + lVar13;
              *puVar1 = *puVar1 ^ pmVar3[(ulong)(iVar9 * uVar8) + lVar13];
              lVar13 = lVar13 + 1;
            } while (lVar13 < X_inout->row_stride);
          }
          bVar4 = 0 < (int)uVar8;
          uVar8 = uVar8 - 1;
        } while (bVar4);
      }
      bVar4 = 1 < (int)uVar6;
      uVar6 = uVar7;
    } while (bVar4);
  }
  return;
}

Assistant:

void MV_GEN_N(_L_mult_inplace)(const MV_GEN_TYPE* LU, MV_GEN_TYPE* X_inout)
{
	for (int i = LU->n_row - 1; i >= 0; --i) {
		if (i >= LU->n_col) {
			/* We're in the rectangle below the triangular part
			 */
			MV_GEN_N(_clear_row)(X_inout /* Y */, i);
			for (int j = LU->n_col - 1; j >= 0; --j) {
				MV_GEN_N(_multadd_row)(X_inout, j,
						MV_GEN_N(_get_el)(LU, i, j),
						X_inout, i);
			}
		} else {
			/* i < LU->n_col, we're in the triangular part */
			for (int j = i - 1; j >= 0; --j) {
				MV_GEN_N(_multadd_row)(X_inout, j,
						MV_GEN_N(_get_el)(LU, i, j),
						X_inout, i);
			}
		}
	}
}